

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomness.c
# Opt level: O1

int rand_bits(uint8_t *dst,size_t num_bits)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = num_bits + 7 >> 3;
  uVar2 = getrandom(dst,uVar3,1);
  iVar1 = -1;
  if (uVar2 == uVar3) {
    iVar1 = 0;
    if ((num_bits & 7) != 0) {
      dst[uVar3 - 1] = dst[uVar3 - 1] & (byte)(0xff << ((byte)(8 - ((byte)num_bits & 7)) & 0x1f));
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int rand_bits(uint8_t* dst, size_t num_bits) {
  const size_t num_bytes      = (num_bits + 7) / 8;
  const size_t num_extra_bits = num_bits % 8;

  if (rand_bytes(dst, num_bytes)) {
    return -1;
  }

  if (num_extra_bits) {
    dst[num_bytes - 1] &= UINT8_C(0xff) << (8 - num_extra_bits);
  }

  return 0;
}